

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O2

void __thiscall
icu_63::Normalizer2Impl::composeAndAppend
          (Normalizer2Impl *this,UChar *src,UChar *limit,UBool doCompose,UBool onlyContiguous,
          UnicodeString *safeMiddle,ReorderingBuffer *buffer,UErrorCode *errorCode)

{
  UErrorCode UVar1;
  UChar *pUVar2;
  UChar *text;
  int32_t textLength;
  ConstChar16Ptr local_a0;
  UChar *local_98;
  UChar *local_90;
  UnicodeString *local_88;
  UChar *local_80;
  UnicodeString middle;
  
  if (buffer->start != buffer->limit) {
    local_88 = safeMiddle;
    pUVar2 = findNextCompBoundary(this,src,limit,onlyContiguous);
    if ((long)pUVar2 - (long)src != 0) {
      local_98 = pUVar2;
      local_90 = limit;
      text = findPreviousCompBoundary(this,buffer->start,buffer->limit,onlyContiguous);
      textLength = (int32_t)((ulong)((long)buffer->limit - (long)text) >> 1);
      UnicodeString::UnicodeString(&middle,text,textLength);
      ReorderingBuffer::removeSuffix(buffer,textLength);
      UnicodeString::operator=(local_88,&middle);
      local_a0.p_ = src;
      UnicodeString::append(&middle,&local_a0,(int32_t)((ulong)((long)pUVar2 - (long)src) >> 1));
      limit = local_90;
      local_80 = local_a0.p_;
      if ((middle.fUnion.fStackFields.fLengthAndFlags & 0x11U) == 0) {
        if ((middle.fUnion.fStackFields.fLengthAndFlags & 2U) != 0) {
          middle.fUnion.fFields.fArray = middle.fUnion.fStackFields.fBuffer;
        }
      }
      else {
        middle.fUnion.fFields.fArray = (char16_t *)0x0;
      }
      if (-1 < middle.fUnion.fStackFields.fLengthAndFlags) {
        middle.fUnion.fFields.fLength = (int)middle.fUnion.fStackFields.fLengthAndFlags >> 5;
      }
      compose(this,middle.fUnion.fFields.fArray,
              (char16_t *)
              ((long)middle.fUnion.fFields.fArray + (long)middle.fUnion.fFields.fLength * 2),
              onlyContiguous,'\x01',buffer,errorCode);
      UVar1 = *errorCode;
      UnicodeString::~UnicodeString(&middle);
      src = local_98;
      if (U_ZERO_ERROR < UVar1) {
        return;
      }
    }
  }
  if (doCompose == '\0') {
    if (limit == (UChar *)0x0) {
      limit = u_strchr_63(src,L'\0');
    }
    ReorderingBuffer::appendZeroCC(buffer,src,limit,errorCode);
  }
  else {
    compose(this,src,limit,onlyContiguous,'\x01',buffer,errorCode);
  }
  return;
}

Assistant:

void Normalizer2Impl::composeAndAppend(const UChar *src, const UChar *limit,
                                       UBool doCompose,
                                       UBool onlyContiguous,
                                       UnicodeString &safeMiddle,
                                       ReorderingBuffer &buffer,
                                       UErrorCode &errorCode) const {
    if(!buffer.isEmpty()) {
        const UChar *firstStarterInSrc=findNextCompBoundary(src, limit, onlyContiguous);
        if(src!=firstStarterInSrc) {
            const UChar *lastStarterInDest=findPreviousCompBoundary(buffer.getStart(),
                                                                    buffer.getLimit(), onlyContiguous);
            int32_t destSuffixLength=(int32_t)(buffer.getLimit()-lastStarterInDest);
            UnicodeString middle(lastStarterInDest, destSuffixLength);
            buffer.removeSuffix(destSuffixLength);
            safeMiddle=middle;
            middle.append(src, (int32_t)(firstStarterInSrc-src));
            const UChar *middleStart=middle.getBuffer();
            compose(middleStart, middleStart+middle.length(), onlyContiguous,
                    TRUE, buffer, errorCode);
            if(U_FAILURE(errorCode)) {
                return;
            }
            src=firstStarterInSrc;
        }
    }
    if(doCompose) {
        compose(src, limit, onlyContiguous, TRUE, buffer, errorCode);
    } else {
        if(limit==NULL) {  // appendZeroCC() needs limit!=NULL
            limit=u_strchr(src, 0);
        }
        buffer.appendZeroCC(src, limit, errorCode);
    }
}